

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetLinkLibrariesCommand.cxx
# Opt level: O1

void LinkLibraryTypeSpecifierWarning(cmMakefile *mf,int left,int right)

{
  char *__s;
  char *__s_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string local_c8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_a8;
  size_t local_90;
  char *local_88;
  undefined8 local_80;
  undefined8 local_78;
  char *local_70;
  undefined8 local_68;
  size_t local_60;
  char *local_58;
  undefined8 local_50;
  undefined8 local_48;
  char *local_40;
  undefined8 local_38;
  
  local_a8.first._M_len = 0x1d;
  local_a8.first._M_str = "Link library type specifier \"";
  local_a8.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  __s = *(char **)((anonymous_namespace)::LinkLibraryTypeNames + (ulong)(uint)left * 8);
  local_90 = strlen(__s);
  local_80 = 0;
  local_78 = 0x1c;
  local_70 = "\" is followed by specifier \"";
  local_68 = 0;
  __s_00 = *(char **)((anonymous_namespace)::LinkLibraryTypeNames + (ulong)(uint)right * 8);
  local_88 = __s;
  local_60 = strlen(__s_00);
  local_50 = 0;
  local_48 = 0x42;
  local_40 = "\" instead of a library name.  The first specifier will be ignored.";
  local_38 = 0;
  views._M_len = 5;
  views._M_array = &local_a8;
  local_58 = __s_00;
  cmCatViews(&local_c8,views);
  cmMakefile::IssueMessage(mf,AUTHOR_WARNING,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

static void LinkLibraryTypeSpecifierWarning(cmMakefile& mf, int left,
                                            int right)
{
  mf.IssueMessage(
    MessageType::AUTHOR_WARNING,
    cmStrCat(
      "Link library type specifier \"", LinkLibraryTypeNames[left],
      "\" is followed by specifier \"", LinkLibraryTypeNames[right],
      "\" instead of a library name.  The first specifier will be ignored."));
}